

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Cpcc cpcc)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  
  switch(cpcc.raw) {
  case 0:
    cVar3 = 'f';
    goto LAB_0012faaf;
  case 1:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'e';
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'q';
    return this;
  case 2:
    cVar3 = 'o';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbogt"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 3:
    cVar3 = 'o';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdboge"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 4:
    cVar3 = 'o';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbolt"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 5:
    cVar3 = 'o';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbole"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 6:
    cVar3 = 'o';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbogl"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 7:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'o';
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'r';
    return this;
  case 8:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'u';
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'n';
    return this;
  case 9:
    cVar3 = 'u';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbueq"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 10:
    cVar3 = 'u';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbugt"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0xb:
    cVar3 = 'u';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbuge"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0xc:
    cVar3 = 'u';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbult"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0xd:
    cVar3 = 'u';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbule"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0xe:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'n';
    goto LAB_0012faec;
  case 0xf:
    cVar3 = 't';
    goto LAB_0012faaf;
  case 0x10:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 's';
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'f';
    return this;
  case 0x11:
    cVar3 = 's';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbseq"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0x12:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'g';
    goto LAB_0012fa24;
  case 0x13:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'g';
    goto LAB_0012faec;
  case 0x14:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
    goto LAB_0012fa24;
  case 0x15:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
LAB_0012faec:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'e';
    return this;
  case 0x16:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'g';
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
    return this;
  case 0x17:
    cVar3 = 'g';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbgle"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0x18:
    cVar3 = 'n';
    lVar2 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbngle"[lVar2 + 4];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0x19:
    cVar3 = 'n';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbngl"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0x1a:
    cVar3 = 'n';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbnle"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0x1b:
    cVar3 = 'n';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbnlt"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0x1c:
    cVar3 = 'n';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbnge"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0x1d:
    cVar3 = 'n';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbngt"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0x1e:
    cVar3 = 's';
    lVar2 = 1;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "fdbsne"[lVar2 + 3];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 0x1f:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 's';
LAB_0012fa24:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = 't';
    return this;
  default:
    cVar3 = '?';
LAB_0012faaf:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = cVar3;
    return this;
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Cpcc cpcc)
{
    switch (cpcc.raw) {

        case 0:  *this << "f";      break;
        case 1:  *this << "eq";     break;
        case 2:  *this << "ogt";    break;
        case 3:  *this << "oge";    break;
        case 4:  *this << "olt";    break;
        case 5:  *this << "ole";    break;
        case 6:  *this << "ogl";    break;
        case 7:  *this << "or";     break;
        case 8:  *this << "un";     break;
        case 9:  *this << "ueq";    break;
        case 10: *this << "ugt";    break;
        case 11: *this << "uge";    break;
        case 12: *this << "ult";    break;
        case 13: *this << "ule";    break;
        case 14: *this << "ne";     break;
        case 15: *this << "t";      break;
        case 16: *this << "sf";     break;
        case 17: *this << "seq";    break;
        case 18: *this << "gt";     break;
        case 19: *this << "ge";     break;
        case 20: *this << "lt";     break;
        case 21: *this << "le";     break;
        case 22: *this << "gl";     break;
        case 23: *this << "gle";    break;
        case 24: *this << "ngle";   break;
        case 25: *this << "ngl";    break;
        case 26: *this << "nle";    break;
        case 27: *this << "nlt";    break;
        case 28: *this << "nge";    break;
        case 29: *this << "ngt";    break;
        case 30: *this << "sne";    break;
        case 31: *this << "st";     break;

        default:
            *this << "?";
    }
    return *this;
}